

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_ptrmap_delete(stb_ptrmap *e,_func_void_void_ptr *free_func)

{
  void *__ptr;
  long lVar1;
  long lVar2;
  
  if (free_func != (_func_void_void_ptr *)0x0) {
    lVar2 = 8;
    for (lVar1 = 0; lVar1 < e->limit; lVar1 = lVar1 + 1) {
      if ((*(ulong *)((long)e->table + lVar2 + -8) | 4) != 6) {
        __ptr = *(void **)((long)&e->table->k + lVar2);
        if (free_func == free) {
          free(__ptr);
        }
        else {
          (*free_func)(__ptr);
        }
      }
      lVar2 = lVar2 + 0x10;
    }
  }
  stb_ptrmap_destroy(e);
  return;
}

Assistant:

void stb_ptrmap_delete(stb_ptrmap *e, void (*free_func)(void *))
{
   int i;
   if (free_func)
      for (i=0; i < e->limit; ++i)
         if (e->table[i].k != STB_EMPTY && e->table[i].k != STB_EDEL) {
            if (free_func == free)
               free(e->table[i].v); // allow STB_MALLOC_WRAPPER to operate
            else
               free_func(e->table[i].v);
         }
   stb_ptrmap_destroy(e);
}